

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall spvtools::opt::IRContext::CheckCFG(IRContext *this)

{
  pointer *this_00;
  value_type vVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  Module *this_01;
  reference this_02;
  Function *this_03;
  reference this_04;
  CFG *this_05;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  mapped_type *__x;
  iterator iVar7;
  iterator iVar8;
  size_type sVar9;
  size_type sVar10;
  reference pvVar11;
  ostream *poVar12;
  reference puVar13;
  iterator iStack_1b8;
  uint32_t i_2;
  iterator __end5_1;
  iterator __begin5_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range5_1;
  iterator iStack_198;
  uint32_t i_1;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range5;
  size_t i;
  bool same;
  uint32_t local_14c;
  undefined1 local_148 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> real;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  value_type *bb_1;
  iterator __end3_1;
  iterator __begin3_1;
  Function *__range3_1;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *local_e0;
  function<void_(unsigned_int)> local_d8;
  Function *local_b8;
  value_type *bb;
  iterator __end3;
  iterator __begin3;
  Function *__range3;
  Function *function;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  undefined1 local_50 [8];
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  real_preds;
  IRContext *this_local;
  
  real_preds._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   *)local_50);
  bVar3 = AreAnalysesValid(this,kAnalysisCFG);
  if (bVar3) {
    this_01 = module(this);
    join_0x00000010_0x00000000_ = Module::begin(this_01);
    _function = Module::end(this_01);
    while (bVar3 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                              &__end2.iterator_,
                              (UptrVectorIterator<spvtools::opt::Function,_false> *)&function),
          bVar3) {
      this_02 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
      join_0x00000010_0x00000000_ = Function::begin(this_02);
      _bb = Function::end(this_02);
      while (bVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                               ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                                &__end3.iterator_,
                                (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&bb), bVar3)
      {
        this_03 = (Function *)
                  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                             &__end3.iterator_);
        local_e0 = (unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    *)local_50;
        __range3_1 = this_03;
        local_b8 = this_03;
        std::function<void(unsigned_int)>::function<spvtools::opt::IRContext::CheckCFG()::__0,void>
                  ((function<void(unsigned_int)> *)&local_d8,(anon_class_16_2_32c5dfea *)&__range3_1
                  );
        BasicBlock::ForEachSuccessorLabel((BasicBlock *)this_03,&local_d8);
        std::function<void_(unsigned_int)>::~function(&local_d8);
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
      }
      join_0x00000010_0x00000000_ = Function::begin(this_02);
      _bb_1 = Function::end(this_02);
      while (bVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                               ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                                &__end3_1.iterator_,
                                (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&bb_1),
            bVar3) {
        this_04 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                             &__end3_1.iterator_);
        this_05 = cfg(this);
        uVar5 = BasicBlock::id(this_04);
        pvVar6 = CFG::preds(this_05,uVar5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &real.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pvVar6);
        local_14c = BasicBlock::id(this_04);
        __x = std::
              unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[]((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            *)local_50,&local_14c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148,__x);
        iVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &real.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &real.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar7._M_current,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar8._M_current);
        iVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
        iVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar7._M_current,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar8._M_current);
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &real.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
        bVar3 = sVar9 == sVar10;
        __range5 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        while( true ) {
          pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
          bVar4 = false;
          if (__range5 < pvVar6) {
            bVar4 = bVar3;
          }
          if (!bVar4) break;
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &real.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)__range5);
          vVar1 = *pvVar11;
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148,
                               (size_type)__range5);
          if (vVar1 != *pvVar11) {
            bVar3 = false;
          }
          __range5 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(__range5->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start + 1);
        }
        if (!bVar3) {
          poVar12 = std::operator<<((ostream *)&std::cerr,"Predecessors for ");
          uVar5 = BasicBlock::id(this_04);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar5);
          std::operator<<(poVar12," are different:\n");
          std::operator<<((ostream *)&std::cerr,"Real:");
          __end5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
          iStack_198 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
          while (bVar4 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffe68), bVar4) {
            puVar13 = __gnu_cxx::
                      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*(&__end5);
            uVar2 = *puVar13;
            poVar12 = std::operator<<((ostream *)&std::cerr,' ');
            std::ostream::operator<<(poVar12,uVar2);
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(&__end5);
          }
          std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
          std::operator<<((ostream *)&std::cerr,"Recorded:");
          this_00 = &real.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          __end5_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
          iStack_1b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
          while (bVar4 = __gnu_cxx::operator!=(&__end5_1,&stack0xfffffffffffffe48), bVar4) {
            puVar13 = __gnu_cxx::
                      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*(&__end5_1);
            uVar2 = *puVar13;
            poVar12 = std::operator<<((ostream *)&std::cerr,' ');
            std::ostream::operator<<(poVar12,uVar2);
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(&__end5_1);
          }
          std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        }
        if (!bVar3) {
          this_local._7_1_ = 0;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &real.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (!bVar3) goto LAB_003cefbe;
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3_1.iterator_);
      }
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_003cefbe:
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IRContext::CheckCFG() {
  std::unordered_map<uint32_t, std::vector<uint32_t>> real_preds;
  if (!AreAnalysesValid(kAnalysisCFG)) {
    return true;
  }

  for (Function& function : *module()) {
    for (const auto& bb : function) {
      bb.ForEachSuccessorLabel([&bb, &real_preds](const uint32_t lab_id) {
        real_preds[lab_id].push_back(bb.id());
      });
    }

    for (auto& bb : function) {
      std::vector<uint32_t> preds = cfg()->preds(bb.id());
      std::vector<uint32_t> real = real_preds[bb.id()];
      std::sort(preds.begin(), preds.end());
      std::sort(real.begin(), real.end());

      bool same = true;
      if (preds.size() != real.size()) {
        same = false;
      }

      for (size_t i = 0; i < real.size() && same; i++) {
        if (preds[i] != real[i]) {
          same = false;
        }
      }

      if (!same) {
        std::cerr << "Predecessors for " << bb.id() << " are different:\n";

        std::cerr << "Real:";
        for (uint32_t i : real) {
          std::cerr << ' ' << i;
        }
        std::cerr << std::endl;

        std::cerr << "Recorded:";
        for (uint32_t i : preds) {
          std::cerr << ' ' << i;
        }
        std::cerr << std::endl;
      }
      if (!same) return false;
    }
  }

  return true;
}